

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

int32 hmm_vit_eval(hmm_t *hmm)

{
  hmm_t *hmm_local;
  
  if (hmm->mpx == '\0') {
    if (hmm->n_emit_state == '\x05') {
      hmm_local._4_4_ = hmm_vit_eval_5st_lr(hmm);
    }
    else if (hmm->n_emit_state == '\x03') {
      hmm_local._4_4_ = hmm_vit_eval_3st_lr(hmm);
    }
    else {
      hmm_local._4_4_ = hmm_vit_eval_anytopo(hmm);
    }
  }
  else if (hmm->n_emit_state == '\x05') {
    hmm_local._4_4_ = hmm_vit_eval_5st_lr_mpx(hmm);
  }
  else if (hmm->n_emit_state == '\x03') {
    hmm_local._4_4_ = hmm_vit_eval_3st_lr_mpx(hmm);
  }
  else {
    hmm_local._4_4_ = hmm_vit_eval_anytopo(hmm);
  }
  return hmm_local._4_4_;
}

Assistant:

int32
hmm_vit_eval(hmm_t * hmm)
{
    if (hmm_is_mpx(hmm)) {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr_mpx(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr_mpx(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
    else {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
}